

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void fdct4x8_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  __m128i *palVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  undefined1 auVar23 [16];
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  undefined1 auVar28 [16];
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  int iVar38;
  int iVar39;
  int iVar40;
  undefined1 auVar37 [16];
  int iVar44;
  int iVar45;
  int iVar46;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  int iVar53;
  int iVar54;
  int iVar55;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  
  auVar23 = ZEXT416((uint)bit);
  lVar22 = (long)bit * 0x100;
  iVar36 = *(int *)((long)vert_filter_length_chroma + lVar22 + 0x1e0);
  iVar20 = -iVar36;
  iVar21 = 1 << ((char)bit - 1U & 0x1f);
  iVar29 = (int)(*in)[0];
  iVar30 = *(int *)((long)*in + 4);
  iVar31 = (int)(*in)[1];
  iVar32 = *(int *)((long)*in + 0xc);
  palVar1 = in + col_num * 7;
  iVar38 = (int)(*palVar1)[0];
  iVar39 = *(int *)((long)*palVar1 + 4);
  iVar40 = (int)(*palVar1)[1];
  iVar49 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + col_num;
  iVar61 = (int)(*palVar1)[0];
  iVar62 = *(int *)((long)*palVar1 + 4);
  iVar63 = (int)(*palVar1)[1];
  iVar64 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + col_num * 6;
  iVar4 = (int)(*palVar1)[0];
  iVar5 = *(int *)((long)*palVar1 + 4);
  iVar6 = (int)(*palVar1)[1];
  iVar7 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + col_num * 2;
  iVar8 = (int)(*palVar1)[0];
  iVar9 = *(int *)((long)*palVar1 + 4);
  iVar10 = (int)(*palVar1)[1];
  iVar11 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + col_num * 5;
  iVar12 = (int)(*palVar1)[0];
  iVar13 = *(int *)((long)*palVar1 + 4);
  iVar14 = (int)(*palVar1)[1];
  iVar15 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + col_num * 3;
  iVar24 = (int)(*palVar1)[0];
  iVar25 = *(int *)((long)*palVar1 + 4);
  iVar26 = (int)(*palVar1)[1];
  iVar27 = *(int *)((long)*palVar1 + 0xc);
  palVar1 = in + (col_num << 2);
  iVar16 = (int)(*palVar1)[0];
  iVar17 = *(int *)((long)*palVar1 + 4);
  iVar18 = (int)(*palVar1)[1];
  iVar19 = *(int *)((long)*palVar1 + 0xc);
  auVar52._4_4_ = iVar36;
  auVar52._0_4_ = iVar36;
  auVar52._8_4_ = iVar36;
  auVar52._12_4_ = iVar36;
  auVar58._4_4_ = iVar20;
  auVar58._0_4_ = iVar20;
  auVar58._8_4_ = iVar20;
  auVar58._12_4_ = iVar20;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar22 + 0x220);
  auVar47._4_4_ = uVar2;
  auVar47._0_4_ = uVar2;
  auVar47._8_4_ = uVar2;
  auVar47._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar22 + 0x1a0);
  auVar51._4_4_ = uVar2;
  auVar51._0_4_ = uVar2;
  auVar51._8_4_ = uVar2;
  auVar51._12_4_ = uVar2;
  iVar20 = iVar38 + iVar29;
  iVar44 = iVar39 + iVar30;
  iVar45 = iVar40 + iVar31;
  iVar46 = iVar49 + iVar32;
  iVar29 = iVar29 - iVar38;
  iVar30 = iVar30 - iVar39;
  iVar31 = iVar31 - iVar40;
  iVar32 = iVar32 - iVar49;
  iVar49 = iVar4 + iVar61;
  iVar53 = iVar5 + iVar62;
  iVar54 = iVar6 + iVar63;
  iVar55 = iVar7 + iVar64;
  auVar34._0_4_ = iVar61 - iVar4;
  auVar34._4_4_ = iVar62 - iVar5;
  auVar34._8_4_ = iVar63 - iVar6;
  auVar34._12_4_ = iVar64 - iVar7;
  iVar36 = iVar12 + iVar8;
  iVar38 = iVar13 + iVar9;
  iVar39 = iVar14 + iVar10;
  iVar40 = iVar15 + iVar11;
  auVar35._0_4_ = iVar8 - iVar12;
  auVar35._4_4_ = iVar9 - iVar13;
  auVar35._8_4_ = iVar10 - iVar14;
  auVar35._12_4_ = iVar11 - iVar15;
  iVar61 = iVar16 + iVar24;
  iVar62 = iVar17 + iVar25;
  iVar63 = iVar18 + iVar26;
  iVar64 = iVar19 + iVar27;
  iVar24 = iVar24 - iVar16;
  iVar25 = iVar25 - iVar17;
  iVar26 = iVar26 - iVar18;
  iVar27 = iVar27 - iVar19;
  auVar59._0_4_ = iVar61 + iVar20;
  auVar59._4_4_ = iVar62 + iVar44;
  auVar59._8_4_ = iVar63 + iVar45;
  auVar59._12_4_ = iVar64 + iVar46;
  auVar41._0_4_ = iVar20 - iVar61;
  auVar41._4_4_ = iVar44 - iVar62;
  auVar41._8_4_ = iVar45 - iVar63;
  auVar41._12_4_ = iVar46 - iVar64;
  auVar28._0_4_ = iVar36 + iVar49;
  auVar28._4_4_ = iVar38 + iVar53;
  auVar28._8_4_ = iVar39 + iVar54;
  auVar28._12_4_ = iVar40 + iVar55;
  auVar50._0_4_ = iVar49 - iVar36;
  auVar50._4_4_ = iVar53 - iVar38;
  auVar50._8_4_ = iVar54 - iVar39;
  auVar50._12_4_ = iVar55 - iVar40;
  auVar37 = pmulld(auVar35,auVar58);
  auVar56 = pmulld(auVar58,auVar34);
  auVar33 = pmulld(auVar34,auVar52);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar22 + 0x240);
  auVar57._4_4_ = uVar2;
  auVar57._0_4_ = uVar2;
  auVar57._8_4_ = uVar2;
  auVar57._12_4_ = uVar2;
  auVar34 = pmulld(auVar35,auVar52);
  auVar58 = pmulld(auVar59,auVar52);
  auVar28 = pmulld(auVar28,auVar52);
  auVar35 = pmulld(auVar50,auVar47);
  auVar59 = pmulld(auVar41,auVar51);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar22 + 0x180);
  auVar60._4_4_ = uVar2;
  auVar60._0_4_ = uVar2;
  auVar60._8_4_ = uVar2;
  auVar60._12_4_ = uVar2;
  auVar41 = pmulld(auVar41,auVar47);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar22 + 0x1c0);
  iVar36 = auVar33._0_4_ + iVar21 + auVar37._0_4_ >> auVar23;
  iVar38 = auVar33._4_4_ + iVar21 + auVar37._4_4_ >> auVar23;
  iVar39 = auVar33._8_4_ + iVar21 + auVar37._8_4_ >> auVar23;
  iVar40 = auVar33._12_4_ + iVar21 + auVar37._12_4_ >> auVar23;
  iVar49 = (iVar21 - auVar56._0_4_) + auVar34._0_4_ >> auVar23;
  iVar61 = (iVar21 - auVar56._4_4_) + auVar34._4_4_ >> auVar23;
  iVar62 = (iVar21 - auVar56._8_4_) + auVar34._8_4_ >> auVar23;
  iVar63 = (iVar21 - auVar56._12_4_) + auVar34._12_4_ >> auVar23;
  auVar51 = pmulld(auVar50,auVar51);
  auVar42._0_4_ = iVar24 + iVar36;
  auVar42._4_4_ = iVar25 + iVar38;
  auVar42._8_4_ = iVar26 + iVar39;
  auVar42._12_4_ = iVar27 + iVar40;
  auVar33._0_4_ = iVar24 - iVar36;
  auVar33._4_4_ = iVar25 - iVar38;
  auVar33._8_4_ = iVar26 - iVar39;
  auVar33._12_4_ = iVar27 - iVar40;
  auVar37._0_4_ = iVar29 - iVar49;
  auVar37._4_4_ = iVar30 - iVar61;
  auVar37._8_4_ = iVar31 - iVar62;
  auVar37._12_4_ = iVar32 - iVar63;
  auVar56._0_4_ = iVar49 + iVar29;
  auVar56._4_4_ = iVar61 + iVar30;
  auVar56._8_4_ = iVar62 + iVar31;
  auVar56._12_4_ = iVar63 + iVar32;
  auVar34 = pmulld(auVar42,auVar57);
  auVar52 = pmulld(auVar56,auVar60);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar22 + 0x200);
  palVar1 = out + col_num;
  *(int *)*palVar1 = auVar34._0_4_ + iVar21 + auVar52._0_4_ >> auVar23;
  *(int *)((long)*palVar1 + 4) = auVar34._4_4_ + iVar21 + auVar52._4_4_ >> auVar23;
  *(int *)(*palVar1 + 1) = auVar34._8_4_ + iVar21 + auVar52._8_4_ >> auVar23;
  *(int *)((long)*palVar1 + 0xc) = auVar34._12_4_ + iVar21 + auVar52._12_4_ >> auVar23;
  auVar34 = pmulld(auVar56,auVar57);
  auVar52 = pmulld(auVar42,auVar60);
  auVar43._4_4_ = uVar2;
  auVar43._0_4_ = uVar2;
  auVar43._8_4_ = uVar2;
  auVar43._12_4_ = uVar2;
  auVar48._4_4_ = uVar3;
  auVar48._0_4_ = uVar3;
  auVar48._8_4_ = uVar3;
  auVar48._12_4_ = uVar3;
  palVar1 = out + col_num * 7;
  *(int *)*palVar1 = (iVar21 - auVar52._0_4_) + auVar34._0_4_ >> auVar23;
  *(int *)((long)*palVar1 + 4) = (iVar21 - auVar52._4_4_) + auVar34._4_4_ >> auVar23;
  *(int *)(*palVar1 + 1) = (iVar21 - auVar52._8_4_) + auVar34._8_4_ >> auVar23;
  *(int *)((long)*palVar1 + 0xc) = (iVar21 - auVar52._12_4_) + auVar34._12_4_ >> auVar23;
  auVar34 = pmulld(auVar33,auVar43);
  auVar52 = pmulld(auVar37,auVar48);
  palVar1 = out + col_num * 5;
  *(int *)*palVar1 = auVar34._0_4_ + iVar21 + auVar52._0_4_ >> auVar23;
  *(int *)((long)*palVar1 + 4) = auVar34._4_4_ + iVar21 + auVar52._4_4_ >> auVar23;
  *(int *)(*palVar1 + 1) = auVar34._8_4_ + iVar21 + auVar52._8_4_ >> auVar23;
  *(int *)((long)*palVar1 + 0xc) = auVar34._12_4_ + iVar21 + auVar52._12_4_ >> auVar23;
  auVar34 = pmulld(auVar37,auVar43);
  auVar33 = pmulld(auVar33,auVar48);
  palVar1 = out + col_num * 3;
  *(int *)*palVar1 = (iVar21 - auVar33._0_4_) + auVar34._0_4_ >> auVar23;
  *(int *)((long)*palVar1 + 4) = (iVar21 - auVar33._4_4_) + auVar34._4_4_ >> auVar23;
  *(int *)(*palVar1 + 1) = (iVar21 - auVar33._8_4_) + auVar34._8_4_ >> auVar23;
  *(int *)((long)*palVar1 + 0xc) = (iVar21 - auVar33._12_4_) + auVar34._12_4_ >> auVar23;
  *(int *)*out = auVar28._0_4_ + iVar21 + auVar58._0_4_ >> auVar23;
  *(int *)((long)*out + 4) = auVar28._4_4_ + iVar21 + auVar58._4_4_ >> auVar23;
  *(int *)(*out + 1) = auVar28._8_4_ + iVar21 + auVar58._8_4_ >> auVar23;
  *(int *)((long)*out + 0xc) = auVar28._12_4_ + iVar21 + auVar58._12_4_ >> auVar23;
  palVar1 = out + (col_num << 2);
  *(int *)*palVar1 = (iVar21 - auVar28._0_4_) + auVar58._0_4_ >> auVar23;
  *(int *)((long)*palVar1 + 4) = (iVar21 - auVar28._4_4_) + auVar58._4_4_ >> auVar23;
  *(int *)(*palVar1 + 1) = (iVar21 - auVar28._8_4_) + auVar58._8_4_ >> auVar23;
  *(int *)((long)*palVar1 + 0xc) = (iVar21 - auVar28._12_4_) + auVar58._12_4_ >> auVar23;
  palVar1 = out + col_num * 2;
  *(int *)*palVar1 = auVar35._0_4_ + iVar21 + auVar59._0_4_ >> auVar23;
  *(int *)((long)*palVar1 + 4) = auVar35._4_4_ + iVar21 + auVar59._4_4_ >> auVar23;
  *(int *)(*palVar1 + 1) = auVar35._8_4_ + iVar21 + auVar59._8_4_ >> auVar23;
  *(int *)((long)*palVar1 + 0xc) = auVar35._12_4_ + iVar21 + auVar59._12_4_ >> auVar23;
  palVar1 = out + col_num * 6;
  *(int *)*palVar1 = (iVar21 - auVar51._0_4_) + auVar41._0_4_ >> auVar23;
  *(int *)((long)*palVar1 + 4) = (iVar21 - auVar51._4_4_) + auVar41._4_4_ >> auVar23;
  *(int *)(*palVar1 + 1) = (iVar21 - auVar51._8_4_) + auVar41._8_4_ >> auVar23;
  *(int *)((long)*palVar1 + 0xc) = (iVar21 - auVar51._12_4_) + auVar41._12_4_ >> auVar23;
  return;
}

Assistant:

static void fdct4x8_sse4_1(__m128i *in, __m128i *out, int bit,
                           const int col_num) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  __m128i u[8], v[8];

  int startidx = 0 * col_num;
  int endidx = 7 * col_num;
  // Even 8 points 0, 2, ..., 14
  // stage 0
  // stage 1
  u[0] = _mm_add_epi32(in[startidx], in[endidx]);
  v[7] = _mm_sub_epi32(in[startidx], in[endidx]);  // v[7]
  startidx += col_num;
  endidx -= col_num;
  u[1] = _mm_add_epi32(in[startidx], in[endidx]);
  u[6] = _mm_sub_epi32(in[startidx], in[endidx]);
  startidx += col_num;
  endidx -= col_num;
  u[2] = _mm_add_epi32(in[startidx], in[endidx]);
  u[5] = _mm_sub_epi32(in[startidx], in[endidx]);
  startidx += col_num;
  endidx -= col_num;
  u[3] = _mm_add_epi32(in[startidx], in[endidx]);
  v[4] = _mm_sub_epi32(in[startidx], in[endidx]);  // v[4]

  // stage 2
  v[0] = _mm_add_epi32(u[0], u[3]);
  v[3] = _mm_sub_epi32(u[0], u[3]);
  v[1] = _mm_add_epi32(u[1], u[2]);
  v[2] = _mm_sub_epi32(u[1], u[2]);

  v[5] = _mm_mullo_epi32(u[5], cospim32);
  v[6] = _mm_mullo_epi32(u[6], cospi32);
  v[5] = _mm_add_epi32(v[5], v[6]);
  v[5] = _mm_add_epi32(v[5], rnding);
  v[5] = _mm_srai_epi32(v[5], bit);

  u[0] = _mm_mullo_epi32(u[5], cospi32);
  v[6] = _mm_mullo_epi32(u[6], cospim32);
  v[6] = _mm_sub_epi32(u[0], v[6]);
  v[6] = _mm_add_epi32(v[6], rnding);
  v[6] = _mm_srai_epi32(v[6], bit);

  // stage 3
  // type 0
  v[0] = _mm_mullo_epi32(v[0], cospi32);
  v[1] = _mm_mullo_epi32(v[1], cospi32);
  u[0] = _mm_add_epi32(v[0], v[1]);
  u[0] = _mm_add_epi32(u[0], rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  u[1] = _mm_sub_epi32(v[0], v[1]);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  // type 1
  v[0] = _mm_mullo_epi32(v[2], cospi48);
  v[1] = _mm_mullo_epi32(v[3], cospi16);
  u[2] = _mm_add_epi32(v[0], v[1]);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  v[0] = _mm_mullo_epi32(v[2], cospi16);
  v[1] = _mm_mullo_epi32(v[3], cospi48);
  u[3] = _mm_sub_epi32(v[1], v[0]);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  u[4] = _mm_add_epi32(v[4], v[5]);
  u[5] = _mm_sub_epi32(v[4], v[5]);
  u[6] = _mm_sub_epi32(v[7], v[6]);
  u[7] = _mm_add_epi32(v[7], v[6]);

  // stage 4
  // stage 5
  v[0] = _mm_mullo_epi32(u[4], cospi56);
  v[1] = _mm_mullo_epi32(u[7], cospi8);
  v[0] = _mm_add_epi32(v[0], v[1]);
  v[0] = _mm_add_epi32(v[0], rnding);
  out[1 * col_num] = _mm_srai_epi32(v[0], bit);  // buf0[4]

  v[0] = _mm_mullo_epi32(u[4], cospi8);
  v[1] = _mm_mullo_epi32(u[7], cospi56);
  v[0] = _mm_sub_epi32(v[1], v[0]);
  v[0] = _mm_add_epi32(v[0], rnding);
  out[7 * col_num] = _mm_srai_epi32(v[0], bit);  // buf0[7]

  v[0] = _mm_mullo_epi32(u[5], cospi24);
  v[1] = _mm_mullo_epi32(u[6], cospi40);
  v[0] = _mm_add_epi32(v[0], v[1]);
  v[0] = _mm_add_epi32(v[0], rnding);
  out[5 * col_num] = _mm_srai_epi32(v[0], bit);  // buf0[5]

  v[0] = _mm_mullo_epi32(u[5], cospi40);
  v[1] = _mm_mullo_epi32(u[6], cospi24);
  v[0] = _mm_sub_epi32(v[1], v[0]);
  v[0] = _mm_add_epi32(v[0], rnding);
  out[3 * col_num] = _mm_srai_epi32(v[0], bit);  // buf0[6]

  out[0 * col_num] = u[0];  // buf0[0]
  out[4 * col_num] = u[1];  // buf0[1]
  out[2 * col_num] = u[2];  // buf0[2]
  out[6 * col_num] = u[3];  // buf0[3]
}